

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  byte *pbVar1;
  size_t sVar2;
  uint symbol;
  BYTE *istart;
  byte *pbVar3;
  BIT_CStream_t bitC;
  FSE_CState_t CState2;
  FSE_CState_t CState1;
  BIT_CStream_t local_98;
  FSE_CState_t local_70;
  FSE_CState_t local_50;
  
  if (srcSize < 3) {
    return 0;
  }
  local_98.bitContainer = 0;
  local_98.bitPos = 0;
  local_98.endPtr = (char *)((long)dst + (dstSize - 8));
  if (dstSize < 9) {
    sVar2 = 0;
  }
  else {
    symbol = (uint)*(byte *)((long)src + (srcSize - 1));
    local_98.startPtr = (char *)dst;
    local_98.ptr = (char *)dst;
    if ((srcSize & 1) == 0) {
      pbVar3 = (byte *)((long)src + (srcSize - 2));
      FSE_initCState2(&local_70,ct,symbol);
      FSE_initCState2(&local_50,ct,(uint)*pbVar3);
    }
    else {
      FSE_initCState2(&local_50,ct,symbol);
      FSE_initCState2(&local_70,ct,(uint)*(byte *)((long)src + (srcSize - 2)));
      pbVar3 = (byte *)((long)src + (srcSize - 3));
      FSE_encodeSymbol(&local_98,&local_50,(uint)*(byte *)((long)src + (srcSize - 3)));
      if (fast == 0) {
        BIT_flushBits(&local_98);
      }
      else {
        BIT_flushBitsFast(&local_98);
      }
    }
    if ((srcSize & 2) == 0) {
      FSE_encodeSymbol(&local_98,&local_70,(uint)pbVar3[-1]);
      pbVar1 = pbVar3 + -2;
      pbVar3 = pbVar3 + -2;
      FSE_encodeSymbol(&local_98,&local_50,(uint)*pbVar1);
      if (fast == 0) {
        BIT_flushBits(&local_98);
      }
      else {
        BIT_flushBitsFast(&local_98);
      }
    }
    for (; src < pbVar3; pbVar3 = pbVar3 + -4) {
      FSE_encodeSymbol(&local_98,&local_70,(uint)pbVar3[-1]);
      FSE_encodeSymbol(&local_98,&local_50,(uint)pbVar3[-2]);
      FSE_encodeSymbol(&local_98,&local_70,(uint)pbVar3[-3]);
      FSE_encodeSymbol(&local_98,&local_50,(uint)pbVar3[-4]);
      if (fast == 0) {
        BIT_flushBits(&local_98);
      }
      else {
        BIT_flushBitsFast(&local_98);
      }
    }
    FSE_flushCState(&local_98,&local_70);
    FSE_flushCState(&local_98,&local_50);
    sVar2 = BIT_closeCStream(&local_98);
  }
  return sVar2;
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}